

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *entry_point,uint32_t scalar_var_id)

{
  PodType (*paPVar1) [2];
  IRContext *this_00;
  DefUseManager *this_01;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  pointer pOVar4;
  uint **ppuVar5;
  bool bVar6;
  char cVar7;
  long *plVar8;
  uint **ppuVar9;
  PodType (*paPVar10) [2];
  ulong uVar11;
  __hashtable *__h;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  pointer pOVar15;
  bool bVar16;
  uint32_t interface_var_id;
  string message;
  uint local_d0;
  array<signed_char,_4UL> local_cc;
  undefined1 local_c8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a8;
  undefined1 local_98 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  Instruction *local_68;
  InterfaceVariableScalarReplacement *local_60;
  DefUseManager *local_58;
  string local_50;
  
  this_00 = (this->super_Pass).context_;
  local_cc._M_elems = (_Type)scalar_var_id;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_d0 = 0;
  if (interface_var->has_result_id_ == true) {
    local_d0 = Instruction::GetSingleWordOperand(interface_var,(uint)interface_var->has_type_id_);
  }
  uVar2 = (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_bucket_count;
  uVar11 = (ulong)local_d0 % uVar2;
  p_Var13 = (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_buckets[uVar11];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var13->_M_nxt, p_Var14 = p_Var13, local_d0 != *(uint *)&p_Var13->_M_nxt[1]._M_nxt))
  {
    while (p_Var13 = p_Var3, p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar11) ||
         (p_Var14 = p_Var13, local_d0 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_005d0ee0;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_005d0ee0:
  if ((p_Var14 == (__node_base_ptr)0x0) || (p_Var14->_M_nxt == (_Hash_node_base *)0x0)) {
    local_98._0_8_ = &local_d0;
    local_98._8_8_ = &local_cc;
    local_98._24_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
         ::_M_invoke;
    local_98._16_8_ =
         std::
         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp:571:7)>
         ::_M_manager;
    pOVar15 = (entry_point->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar4 = (entry_point->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar16 = pOVar15 == pOVar4;
    local_68 = entry_point;
    local_60 = this;
    local_58 = this_01;
    if (!bVar16) {
      bVar16 = false;
      do {
        bVar6 = spvIsInIdType(pOVar15->type);
        if (bVar6) {
          ppuVar5 = (uint **)(pOVar15->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar9 = &(pOVar15->words).small_data_;
          if (ppuVar5 != (uint **)0x0) {
            ppuVar9 = ppuVar5;
          }
          local_c8._0_8_ = *ppuVar9;
          if ((code *)local_98._16_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar7 = (*(code *)local_98._24_8_)(local_98,local_c8);
          if (cVar7 == '\0') break;
        }
        pOVar15 = pOVar15 + 1;
        bVar16 = pOVar15 == pOVar4;
      } while (!bVar16);
    }
    if ((code *)local_98._16_8_ != (code *)0x0) {
      (*(code *)local_98._16_8_)(local_98,local_98,3);
    }
    if (bVar16 == false) {
      puVar12 = &local_60->interface_vars_removed_from_entry_point_operands_;
      analysis::DefUseManager::AnalyzeInstUse(local_58,local_68);
      local_98._0_8_ = puVar12;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar12,&local_d0);
    }
    else {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"interface variable is not an operand of the entry point","");
      Instruction::PrettyPrint_abi_cxx11_(&local_50,interface_var,0x40);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x79aaaa);
      paPVar1 = (PodType (*) [2])(local_c8 + 0x10);
      paPVar10 = (PodType (*) [2])(plVar8 + 2);
      if ((PodType (*) [2])*plVar8 == paPVar10) {
        local_c8._16_8_ = *paPVar10;
        local_c8._24_8_ = plVar8[3];
        local_c8._0_8_ = paPVar1;
      }
      else {
        local_c8._16_8_ = *paPVar10;
        local_c8._0_8_ = (PodType (*) [2])*plVar8;
      }
      local_c8._8_8_ = plVar8[1];
      *plVar8 = (long)paPVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append(local_98,local_c8._0_8_);
      if ((PodType (*) [2])local_c8._0_8_ != paPVar1) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Instruction::PrettyPrint_abi_cxx11_(&local_50,local_68,0x40);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x79aaaa);
      paPVar10 = (PodType (*) [2])(plVar8 + 2);
      if ((PodType (*) [2])*plVar8 == paPVar10) {
        local_c8._16_8_ = *paPVar10;
        local_c8._24_8_ = plVar8[3];
        local_c8._0_8_ = paPVar1;
      }
      else {
        local_c8._16_8_ = *paPVar10;
        local_c8._0_8_ = (PodType (*) [2])*plVar8;
      }
      local_c8._8_8_ = plVar8[1];
      *plVar8 = (long)paPVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append(local_98,local_c8._0_8_);
      if ((PodType (*) [2])local_c8._0_8_ != paPVar1) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_c8._0_8_ = (_func_int **)0x0;
      local_c8._8_8_ = 0;
      local_c8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_c8._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&((local_60->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",
                   (spv_position_t *)local_c8,(char *)local_98._0_8_);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
    }
    bVar16 = (bool)(bVar16 ^ 1);
  }
  else {
    local_c8._24_8_ = local_c8 + 0x10;
    local_c8._0_8_ = &PTR__SmallVector_009488e0;
    local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8[0x10] = local_cc._M_elems[0];
    local_c8[0x11] = local_cc._M_elems[1];
    local_c8[0x12] = local_cc._M_elems[2];
    local_c8[0x13] = local_cc._M_elems[3];
    local_c8._8_8_ = 1;
    local_98._0_4_ = SPV_OPERAND_TYPE_ID;
    local_98._8_8_ = &PTR__SmallVector_009488e0;
    local_98._16_8_ = 0;
    local_98._32_8_ = local_98 + 0x18;
    local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_c8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&entry_point->operands_,(Operand *)local_98);
    local_98._8_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_70,local_70._M_head_impl);
    }
    local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_c8._0_8_ = &PTR__SmallVector_009488e0;
    if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_a8,local_a8._M_head_impl);
    }
    analysis::DefUseManager::AnalyzeInstUse(this_01,entry_point);
    bVar16 = true;
  }
  return bVar16;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint(
    Instruction* interface_var, Instruction* entry_point,
    uint32_t scalar_var_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t interface_var_id = interface_var->result_id();
  if (interface_vars_removed_from_entry_point_operands_.find(
          interface_var_id) !=
      interface_vars_removed_from_entry_point_operands_.end()) {
    entry_point->AddOperand({SPV_OPERAND_TYPE_ID, {scalar_var_id}});
    def_use_mgr->AnalyzeInstUse(entry_point);
    return true;
  }

  bool success = !entry_point->WhileEachInId(
      [&interface_var_id, &scalar_var_id](uint32_t* id) {
        if (*id == interface_var_id) {
          *id = scalar_var_id;
          return false;
        }
        return true;
      });
  if (!success) {
    std::string message(
        "interface variable is not an operand of the entry point");
    message += "\n  " + interface_var->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    message += "\n  " + entry_point->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    return false;
  }

  def_use_mgr->AnalyzeInstUse(entry_point);
  interface_vars_removed_from_entry_point_operands_.insert(interface_var_id);
  return true;
}